

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ClassDeclarationSyntax::ClassDeclarationSyntax
          (ClassDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token virtualOrInterface,
          Token classKeyword,Token lifetime,Token name,ParameterPortListSyntax *parameters,
          ExtendsClauseSyntax *extendsClause,ImplementsClauseSyntax *implementsClause,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClass,
          NamedBlockClauseSyntax *endBlockName)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  Token TVar4;
  iterator ppMVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ClassDeclarationSyntax *this_local;
  Token classKeyword_local;
  Token virtualOrInterface_local;
  
  TVar4 = endClass;
  TVar3 = semi;
  TVar2 = name;
  TVar1 = lifetime;
  uVar7 = classKeyword._0_8_;
  uVar6 = virtualOrInterface._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ClassDeclaration,attributes);
  (this->virtualOrInterface).kind = (short)uVar6;
  (this->virtualOrInterface).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->virtualOrInterface).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->virtualOrInterface).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->virtualOrInterface).info = virtualOrInterface.info;
  (this->classKeyword).kind = (short)uVar7;
  (this->classKeyword).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->classKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->classKeyword).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->classKeyword).info = classKeyword.info;
  (this->lifetime).kind = lifetime.kind;
  (this->lifetime).field_0x2 = lifetime._2_1_;
  (this->lifetime).numFlags = (NumericTokenFlags)lifetime.numFlags.raw;
  (this->lifetime).rawLen = lifetime.rawLen;
  lifetime.info = TVar1.info;
  (this->lifetime).info = lifetime.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  name.info = TVar2.info;
  (this->name).info = name.info;
  this->parameters = parameters;
  this->extendsClause = extendsClause;
  this->implementsClause = implementsClause;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar3.info;
  (this->semi).info = semi.info;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(&this->items,items);
  (this->endClass).kind = endClass.kind;
  (this->endClass).field_0x2 = endClass._2_1_;
  (this->endClass).numFlags = (NumericTokenFlags)endClass.numFlags.raw;
  (this->endClass).rawLen = endClass.rawLen;
  endClass.info = TVar4.info;
  (this->endClass).info = endClass.info;
  this->endBlockName = endBlockName;
  if (this->parameters != (ParameterPortListSyntax *)0x0) {
    (this->parameters->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->extendsClause != (ExtendsClauseSyntax *)0x0) {
    (this->extendsClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->implementsClause != (ImplementsClauseSyntax *)0x0) {
    (this->implementsClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(this->items).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar5 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(this->items).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar5; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClassDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token virtualOrInterface, Token classKeyword, Token lifetime, Token name, ParameterPortListSyntax* parameters, ExtendsClauseSyntax* extendsClause, ImplementsClauseSyntax* implementsClause, Token semi, const SyntaxList<MemberSyntax>& items, Token endClass, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClassDeclaration, attributes), virtualOrInterface(virtualOrInterface), classKeyword(classKeyword), lifetime(lifetime), name(name), parameters(parameters), extendsClause(extendsClause), implementsClause(implementsClause), semi(semi), items(items), endClass(endClass), endBlockName(endBlockName) {
        if (this->parameters) this->parameters->parent = this;
        if (this->extendsClause) this->extendsClause->parent = this;
        if (this->implementsClause) this->implementsClause->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }